

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  char *pcVar1;
  size_t sVar2;
  char *__ptr;
  size_t sVar3;
  size_t sVar4;
  
  if (file == (FILE *)0x0) {
    pcVar1 = (char *)0x0;
    sVar3 = 0;
  }
  else {
    sVar4 = 0x200;
    sVar3 = 0;
    __ptr = (char *)0x0;
    do {
      pcVar1 = __ptr;
      if (sVar4 == sVar3 || __ptr == (char *)0x0) {
        if (((long)(sVar4 + 1) < 0) ||
           (pcVar1 = (char *)realloc(__ptr,sVar4 * 2 + 1), pcVar1 == (char *)0x0))
        goto LAB_00118dc6;
        sVar4 = sVar4 * 2;
      }
      sVar2 = fread(pcVar1 + sVar3,1,sVar4 - sVar3,(FILE *)file);
      sVar3 = sVar3 + sVar2;
      __ptr = pcVar1;
    } while (sVar2 != 0);
    pcVar1[sVar3] = '\0';
    if ((sVar4 != sVar3) && (pcVar1 = (char *)realloc(pcVar1,sVar3 + 1), pcVar1 == (char *)0x0)) {
LAB_00118dc6:
      free(__ptr);
      return PARAM_NO_MEM;
    }
    if (sVar3 == 0) {
      free(pcVar1);
      pcVar1 = (char *)0x0;
      sVar3 = 0;
    }
  }
  *size = sVar3;
  *bufp = pcVar1;
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  char *newbuf;
  char *buffer = NULL;
  size_t nused = 0;

  if(file) {
    size_t nread;
    size_t alloc = 512;
    do {
      if(!buffer || (alloc == nused)) {
        /* size_t overflow detection for huge files */
        if(alloc + 1 > ((size_t)-1)/2) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        alloc *= 2;
        /* allocate an extra char, reserved space, for null termination */
        newbuf = realloc(buffer, alloc + 1);
        if(!newbuf) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        buffer = newbuf;
      }
      nread = fread(buffer + nused, 1, alloc-nused, file);
      nused += nread;
    } while(nread);
    /* null terminate the buffer in case it's used as a string later */
    buffer[nused] = '\0';
    /* free trailing slack space, if possible */
    if(alloc != nused) {
      newbuf = realloc(buffer, nused + 1);
      if(!newbuf) {
        Curl_safefree(buffer);
        return PARAM_NO_MEM;
      }
      buffer = newbuf;
    }
    /* discard buffer if nothing was read */
    if(!nused) {
      Curl_safefree(buffer); /* no string */
    }
  }
  *size = nused;
  *bufp = buffer;
  return PARAM_OK;
}